

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

uint HIST_count_simple(uint *count,uint *maxSymbolValuePtr,void *src,size_t srcSize)

{
  long in_RCX;
  byte *in_RDX;
  uint *in_RSI;
  void *in_RDI;
  U32 s;
  uint largestCount;
  uint maxSymbolValue;
  BYTE *end;
  BYTE *ip;
  uint local_44;
  uint local_40;
  uint local_3c;
  byte *local_30;
  uint local_4;
  
  local_3c = *in_RSI;
  local_40 = 0;
  memset(in_RDI,0,(ulong)(local_3c + 1) << 2);
  local_30 = in_RDX;
  if (in_RCX == 0) {
    *in_RSI = 0;
    local_4 = 0;
  }
  else {
    while (local_30 < in_RDX + in_RCX) {
      if (local_3c < *local_30) {
        __assert_fail("*ip <= maxSymbolValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3a4e,
                      "unsigned int HIST_count_simple(unsigned int *, unsigned int *, const void *, size_t)"
                     );
      }
      *(int *)((long)in_RDI + (ulong)*local_30 * 4) =
           *(int *)((long)in_RDI + (ulong)*local_30 * 4) + 1;
      local_30 = local_30 + 1;
    }
    while (*(int *)((long)in_RDI + (ulong)local_3c * 4) == 0) {
      local_3c = local_3c - 1;
    }
    *in_RSI = local_3c;
    for (local_44 = 0; local_44 <= local_3c; local_44 = local_44 + 1) {
      if (local_40 < *(uint *)((long)in_RDI + (ulong)local_44 * 4)) {
        local_40 = *(uint *)((long)in_RDI + (ulong)local_44 * 4);
      }
    }
    local_4 = local_40;
  }
  return local_4;
}

Assistant:

unsigned HIST_count_simple(unsigned* count, unsigned* maxSymbolValuePtr,
                           const void* src, size_t srcSize)
{
    const BYTE* ip = (const BYTE*)src;
    const BYTE* const end = ip + srcSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned largestCount=0;

    ZSTD_memset(count, 0, (maxSymbolValue+1) * sizeof(*count));
    if (srcSize==0) { *maxSymbolValuePtr = 0; return 0; }

    while (ip<end) {
        assert(*ip <= maxSymbolValue);
        count[*ip++]++;
    }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;

    {   U32 s;
        for (s=0; s<=maxSymbolValue; s++)
            if (count[s] > largestCount) largestCount = count[s];
    }

    return largestCount;
}